

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metablock.c
# Opt level: O2

void BrotliBuildMetaBlockGreedy
               (MemoryManager *m,uint8_t *ringbuffer,size_t pos,size_t mask,uint8_t prev_byte,
               uint8_t prev_byte2,ContextLut literal_context_lut,size_t num_contexts,
               uint32_t *static_context_map,Command *commands,size_t n_commands,MetaBlockSplit *mb)

{
  byte bVar1;
  ushort uVar2;
  ushort uVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  size_t __n;
  undefined1 auVar7 [16];
  Command *pCVar8;
  ulong uVar9;
  ulong uVar10;
  HistogramLiteral *__s;
  uint32_t *puVar11;
  size_t sVar12;
  size_t sVar13;
  long lVar14;
  ulong uVar15;
  uint uVar16;
  bool bVar17;
  undefined4 in_XMM0_Da;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 in_XMM0_Db;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  MemoryManager *pMVar18;
  size_t *in_stack_fffffffffffffd60;
  ulong uVar19;
  size_t local_290;
  anon_union_328_2_32013c24 lit_blocks;
  BlockSplitterDistance dist_blocks;
  BlockSplitterCommand cmd_blocks;
  
  local_290 = pos;
  if (num_contexts == 1) {
    sVar13 = 0;
    pCVar8 = commands;
    sVar12 = n_commands;
    while (bVar17 = sVar12 != 0, sVar12 = sVar12 - 1, bVar17) {
      sVar13 = sVar13 + pCVar8->insert_len_;
      pCVar8 = pCVar8 + 1;
    }
    pMVar18 = m;
    InitBlockSplitterLiteral
              (m,&lit_blocks.plain,sVar13,(size_t)mb,(double)CONCAT44(in_XMM0_Db,in_XMM0_Da),
               (size_t)&mb->literal_histograms,(BlockSplit *)&mb->literal_histograms_size,
               (HistogramLiteral **)m,in_stack_fffffffffffffd60);
    InitBlockSplitterCommand
              (m,&cmd_blocks,n_commands,(size_t)&mb->command_split,
               (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da),(size_t)&mb->command_histograms,
               (BlockSplit *)&mb->command_histograms_size,(HistogramCommand **)pMVar18,
               in_stack_fffffffffffffd60);
    InitBlockSplitterDistance
              (m,&dist_blocks,n_commands,(size_t)&mb->distance_split,
               (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00),
               (size_t)&mb->distance_histograms,(BlockSplit *)&mb->distance_histograms_size,
               (HistogramDistance **)pMVar18,in_stack_fffffffffffffd60);
    for (sVar12 = 0; sVar12 != n_commands; sVar12 = sVar12 + 1) {
      uVar4 = commands[sVar12].insert_len_;
      uVar16 = commands[sVar12].copy_len_;
      uVar2 = commands[sVar12].cmd_prefix_;
      uVar3 = commands[sVar12].dist_prefix_;
      BlockSplitterAddSymbolCommand(&cmd_blocks,(ulong)uVar2);
      sVar13 = local_290;
      for (lVar14 = 0; -lVar14 != (ulong)uVar4; lVar14 = lVar14 + -1) {
        BlockSplitterAddSymbolLiteral(&lit_blocks.plain,(ulong)ringbuffer[sVar13 & mask]);
        sVar13 = sVar13 + 1;
      }
      uVar16 = uVar16 & 0x1ffffff;
      if ((uVar16 != 0) && (0x7f < uVar2)) {
        BlockSplitterAddSymbolDistance(&dist_blocks,(ulong)(uVar3 & 0x3ff));
      }
      local_290 = (local_290 + uVar16) - lVar14;
    }
    BlockSplitterFinishBlockLiteral(&lit_blocks.plain,1);
    BlockSplitterFinishBlockCommand(&cmd_blocks,1);
    BlockSplitterFinishBlockDistance(&dist_blocks,1);
  }
  else {
    uVar15 = 0;
    pCVar8 = commands;
    sVar12 = n_commands;
    while (bVar17 = sVar12 != 0, sVar12 = sVar12 - 1, bVar17) {
      uVar15 = uVar15 + pCVar8->insert_len_;
      pCVar8 = pCVar8 + 1;
    }
    lit_blocks.ctx.histograms_size_ = &mb->literal_histograms_size;
    lit_blocks.plain.alphabet_size_ = 0x100;
    lit_blocks.plain.min_block_size_ = num_contexts;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = num_contexts;
    lit_blocks.ctx.max_block_types_ = SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x100)) / auVar7,0);
    lit_blocks.plain.num_blocks_ = 0x200;
    lit_blocks.plain.split_ = (BlockSplit *)0x4079000000000000;
    lit_blocks.plain.histograms_ = (HistogramLiteral *)0x0;
    uVar15 = uVar15 >> 9;
    uVar19 = uVar15 + 1;
    lit_blocks.ctx.split_ = &mb->literal_split;
    lit_blocks.plain.curr_histogram_ix_ = 0x200;
    lit_blocks.ctx.merge_last_count_ = 0;
    uVar9 = lit_blocks.ctx.max_block_types_ + 1;
    if (uVar19 < lit_blocks.ctx.max_block_types_ + 1) {
      uVar9 = uVar19;
    }
    lit_blocks.plain.last_histogram_ix_[0] = 0;
    lit_blocks.plain.last_histogram_ix_[1] = 0;
    uVar6 = (mb->literal_split).types_alloc_size;
    if (uVar6 <= uVar15) {
      if (uVar6 == 0) {
        uVar6 = uVar19;
      }
      do {
        uVar10 = uVar6;
        uVar6 = uVar10 * 2;
      } while (uVar10 <= uVar15);
      in_stack_fffffffffffffd60 = (size_t *)BrotliAllocate(m,uVar10);
      __n = (mb->literal_split).types_alloc_size;
      if (__n != 0) {
        memcpy(in_stack_fffffffffffffd60,(mb->literal_split).types,__n);
      }
      BrotliFree(m,(mb->literal_split).types);
      (mb->literal_split).types = (uint8_t *)in_stack_fffffffffffffd60;
      (mb->literal_split).types_alloc_size = uVar10;
    }
    uVar6 = (mb->literal_split).lengths_alloc_size;
    if (uVar6 <= uVar15) {
      if (uVar6 == 0) {
        uVar6 = uVar19;
      }
      do {
        uVar10 = uVar6;
        uVar6 = uVar10 * 2;
      } while (uVar10 <= uVar15);
      in_stack_fffffffffffffd60 = (size_t *)BrotliAllocate(m,uVar10 * 4);
      sVar12 = (mb->literal_split).lengths_alloc_size;
      if (sVar12 != 0) {
        memcpy(in_stack_fffffffffffffd60,(mb->literal_split).lengths,sVar12 << 2);
      }
      BrotliFree(m,(mb->literal_split).lengths);
      (mb->literal_split).lengths = (uint32_t *)in_stack_fffffffffffffd60;
      (mb->literal_split).lengths_alloc_size = uVar10;
    }
    (mb->literal_split).num_blocks = uVar19;
    sVar12 = uVar9 * num_contexts;
    mb->literal_histograms_size = sVar12;
    if (sVar12 == 0) {
      __s = (HistogramLiteral *)0x0;
    }
    else {
      __s = (HistogramLiteral *)BrotliAllocate(m,sVar12 * 0x410);
    }
    mb->literal_histograms = __s;
    sVar12 = num_contexts;
    lit_blocks.ctx.histograms_ = __s;
    while (bVar17 = sVar12 != 0, sVar12 = sVar12 - 1, bVar17) {
      memset(__s,0,0x408);
      __s->bit_cost_ = INFINITY;
      __s = __s + 1;
    }
    lit_blocks.plain.last_entropy_[0] = 0.0;
    lit_blocks.plain.last_entropy_[1] = 0.0;
    pMVar18 = m;
    InitBlockSplitterCommand
              (m,&cmd_blocks,n_commands,(size_t)&mb->command_split,0.0,
               (size_t)&mb->command_histograms,(BlockSplit *)&mb->command_histograms_size,
               (HistogramCommand **)m,in_stack_fffffffffffffd60);
    InitBlockSplitterDistance
              (m,&dist_blocks,n_commands,(size_t)&mb->distance_split,
               (double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01),
               (size_t)&mb->distance_histograms,(BlockSplit *)&mb->distance_histograms_size,
               (HistogramDistance **)pMVar18,in_stack_fffffffffffffd60);
    for (sVar12 = 0; sVar12 != n_commands; sVar12 = sVar12 + 1) {
      uVar4 = commands[sVar12].insert_len_;
      uVar16 = commands[sVar12].copy_len_;
      uVar2 = commands[sVar12].dist_prefix_;
      uVar19 = (ulong)commands[sVar12].cmd_prefix_;
      BlockSplitterAddSymbolCommand(&cmd_blocks,(ulong)commands[sVar12].cmd_prefix_);
      bVar1 = prev_byte;
      for (uVar15 = 0; prev_byte = bVar1, uVar4 != uVar15; uVar15 = uVar15 + 1) {
        bVar1 = ringbuffer[local_290 + uVar15 & mask];
        uVar5 = static_context_map
                [literal_context_lut[(ulong)prev_byte2 + 0x100] | literal_context_lut[prev_byte]];
        lit_blocks.ctx.histograms_[lit_blocks.plain.last_histogram_ix_[1] + uVar5].data_[bVar1] =
             lit_blocks.ctx.histograms_[lit_blocks.plain.last_histogram_ix_[1] + uVar5].data_[bVar1]
             + 1;
        lit_blocks.ctx.histograms_[lit_blocks.plain.last_histogram_ix_[1] + uVar5].total_count_ =
             lit_blocks.ctx.histograms_[lit_blocks.plain.last_histogram_ix_[1] + uVar5].total_count_
             + 1;
        lit_blocks.plain.last_histogram_ix_[0] = lit_blocks.plain.last_histogram_ix_[0] + 1;
        if (lit_blocks.plain.last_histogram_ix_[0] == lit_blocks.plain.curr_histogram_ix_) {
          ContextBlockSplitterFinishBlock(&lit_blocks.ctx,pMVar18,0);
        }
        prev_byte2 = prev_byte;
      }
      uVar9 = (ulong)(uVar16 & 0x1ffffff);
      if ((uVar16 & 0x1ffffff) != 0) {
        lVar14 = local_290 + uVar9;
        prev_byte2 = ringbuffer[(uVar15 + lVar14) - 2 & mask];
        prev_byte = ringbuffer[(uVar15 + lVar14) - 1 & mask];
        if (0x7f < (ushort)uVar19) {
          BlockSplitterAddSymbolDistance(&dist_blocks,(ulong)(uVar2 & 0x3ff));
        }
      }
      local_290 = local_290 + uVar15 + uVar9;
    }
    ContextBlockSplitterFinishBlock(&lit_blocks.ctx,pMVar18,1);
    BlockSplitterFinishBlockCommand(&cmd_blocks,1);
    BlockSplitterFinishBlockDistance(&dist_blocks,1);
    sVar12 = (mb->literal_split).num_types;
    mb->literal_context_map_size = sVar12 << 6;
    if (sVar12 << 6 == 0) {
      puVar11 = (uint32_t *)0x0;
    }
    else {
      puVar11 = (uint32_t *)BrotliAllocate(pMVar18,sVar12 << 8);
      sVar12 = (mb->literal_split).num_types;
    }
    mb->literal_context_map = puVar11;
    for (sVar13 = 0; sVar13 != sVar12; sVar13 = sVar13 + 1) {
      for (lVar14 = 0; lVar14 != 0x40; lVar14 = lVar14 + 1) {
        puVar11[lVar14] = static_context_map[lVar14] + (int)sVar13 * (int)num_contexts;
      }
      puVar11 = puVar11 + 0x40;
    }
  }
  return;
}

Assistant:

void BrotliBuildMetaBlockGreedy(MemoryManager* m,
                                const uint8_t* ringbuffer,
                                size_t pos,
                                size_t mask,
                                uint8_t prev_byte,
                                uint8_t prev_byte2,
                                ContextLut literal_context_lut,
                                size_t num_contexts,
                                const uint32_t* static_context_map,
                                const Command* commands,
                                size_t n_commands,
                                MetaBlockSplit* mb) {
  if (num_contexts == 1) {
    BrotliBuildMetaBlockGreedyInternal(m, ringbuffer, pos, mask, prev_byte,
        prev_byte2, literal_context_lut, 1, NULL, commands, n_commands, mb);
  } else {
    BrotliBuildMetaBlockGreedyInternal(m, ringbuffer, pos, mask, prev_byte,
        prev_byte2, literal_context_lut, num_contexts, static_context_map,
        commands, n_commands, mb);
  }
}